

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type)

{
  bool bVar1;
  uint uVar2;
  CompilerError *this_00;
  uint32_t i;
  ulong uVar3;
  allocator local_41;
  string local_40;
  
  if (((this->backend).use_array_constructor == true) &&
     (1 < (type->array).super_VectorView<unsigned_int>.buffer_size)) {
    if ((this->options).flatten_multidimensional_arrays == true) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Cannot flatten constructors of multidimensional array constructors, e.g. float[][]()."
                );
LAB_002d8bbd:
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar1 = (this->options).es;
    uVar2 = (this->options).version;
    if (uVar2 < 0x1ae && bVar1 == false) {
      ::std::__cxx11::string::string((string *)&local_40,"GL_ARB_arrays_of_arrays",&local_41);
      require_extension_internal(this,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
    else if ((bVar1 & uVar2 < 0x136) == 1) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Arrays of arrays not supported before ESSL version 310.");
      goto LAB_002d8bbd;
    }
  }
  uVar3 = 0;
  (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,type,0);
  if ((this->backend).use_array_constructor == true) {
    for (; uVar3 < (type->array).super_VectorView<unsigned_int>.buffer_size;
        uVar3 = (ulong)((int)uVar3 + 1)) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl_constructor(const SPIRType &type)
{
	if (backend.use_array_constructor && type.array.size() > 1)
	{
		if (options.flatten_multidimensional_arrays)
			SPIRV_CROSS_THROW("Cannot flatten constructors of multidimensional array constructors, "
			                  "e.g. float[][]().");
		else if (!options.es && options.version < 430)
			require_extension_internal("GL_ARB_arrays_of_arrays");
		else if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("Arrays of arrays not supported before ESSL version 310.");
	}

	auto e = type_to_glsl(type);
	if (backend.use_array_constructor)
	{
		for (uint32_t i = 0; i < type.array.size(); i++)
			e += "[]";
	}
	return e;
}